

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::EventLog(EventLog *this,ThreadContext *threadContext)

{
  UnlinkableSlabAllocator *this_00;
  SlabAllocator *this_01;
  Recycler *this_02;
  Recycler *alloc;
  BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_03;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  this->m_threadContext = threadContext;
  this_00 = &this->m_eventSlabAllocator;
  SlabAllocatorBase<8>::SlabAllocatorBase(this_00,0x40000);
  this_01 = &this->m_miscSlabAllocator;
  data._32_8_ = this_00;
  SlabAllocatorBase<0>::SlabAllocatorBase(this_01,0x8000);
  this->m_eventTimeCtr = 0;
  (this->m_timer).m_timer.data.cacheSysTime = 0.0;
  (this->m_timer).m_timer.data.cacheTick = 0xffffffffffffffff;
  (this->m_timer).m_timer.data.previousDifference = 0;
  this->m_topLevelCallbackEventTime = -1;
  this->m_eventListVTable = (EventLogEntryVTableEntry *)0x0;
  TTEventList::TTEventList(&this->m_eventList,this_00);
  TTEventList::Iterator::Iterator(&this->m_currentReplayEventIterator);
  TTModeStack::TTModeStack(&this->m_modeStack);
  this->m_currentMode = Invalid;
  this->m_autoTracesEnabled = true;
  SnapshotExtractor::SnapshotExtractor(&this->m_snapExtractor);
  this->m_elapsedExecutionTimeSinceSnapshot = 0.0;
  this->m_lastInflateSnapshotTime = -1;
  this->m_lastInflateMap = (InflateMap *)0x0;
  (this->m_propertyRecordPinSet).ptr =
       (BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  UnorderedArrayList<TTD::NSSnapType::SnapPropertyRecord,_2048UL>::UnorderedArrayList
            (&this->m_propertyRecordList,this_01);
  this->m_sourceInfoCount = 0;
  UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
  UnorderedArrayList(&this->m_loadedTopLevelScripts,this_01);
  UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::
  UnorderedArrayList(&this->m_newFunctionTopLevelScripts,this_01);
  UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
  UnorderedArrayList(&this->m_evalTopLevelScripts,this_01);
  InitializeEventListVTable(this);
  (this->m_eventList).m_vtable = this->m_eventListVTable;
  TTModeStack::Push(&this->m_modeStack,Invalid);
  this_02 = threadContext->recycler;
  local_70 = (undefined1  [8])
             &JsUtil::
              BaseHashSet<Js::PropertyRecord*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord*,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3f03208;
  data.filename._0_4_ = 0x25a;
  alloc = Memory::Recycler::TrackAllocInfo(this_02,(TrackAllocData *)local_70);
  this_03 = (BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
  JsUtil::
  BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_03,this_02,0);
  Memory::
  RecyclerRootPtr<JsUtil::BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_propertyRecordPinSet,
         (BaseHashSet<Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          *)this_03,this_02);
  return;
}

Assistant:

EventLog::EventLog(ThreadContext* threadContext)
        : m_threadContext(threadContext), m_eventSlabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_MID), m_miscSlabAllocator(TTD_SLAB_BLOCK_ALLOCATION_SIZE_SMALL),
        m_eventTimeCtr(0), m_timer(), m_topLevelCallbackEventTime(-1),
        m_eventListVTable(nullptr), m_eventList(&this->m_eventSlabAllocator), m_currentReplayEventIterator(),
        m_modeStack(), m_currentMode(TTDMode::Invalid), m_autoTracesEnabled(true),
        m_snapExtractor(), m_elapsedExecutionTimeSinceSnapshot(0.0),
        m_lastInflateSnapshotTime(-1), m_lastInflateMap(nullptr), m_propertyRecordList(&this->m_miscSlabAllocator),
        m_sourceInfoCount(0), m_loadedTopLevelScripts(&this->m_miscSlabAllocator), m_newFunctionTopLevelScripts(&this->m_miscSlabAllocator), m_evalTopLevelScripts(&this->m_miscSlabAllocator)
    {
        this->InitializeEventListVTable();
        this->m_eventList.SetVTable(this->m_eventListVTable);

        this->m_modeStack.Push(TTDMode::Invalid);

        Recycler * recycler = threadContext->GetRecycler();
        this->m_propertyRecordPinSet.Root(RecyclerNew(recycler, PropertyRecordPinSet, recycler), recycler);
    }